

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O2

void __thiscall
tchecker::zg::path::symbolic::lasso_path_t::attributes
          (lasso_path_t *this,node_t *n,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *m)

{
  byte bVar1;
  mapped_type *pmVar2;
  allocator<char> local_31;
  key_type local_30;
  
  tchecker::ts::
  lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
  ::attributes(&this->
                super_lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
               ,n,m);
  bVar1 = (n->super_node_flags_t)._flags;
  if (((n->super_node_flags_t).NODE_INITIAL & bVar1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"initial",&local_31);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](m,&local_30);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_30);
    bVar1 = (n->super_node_flags_t)._flags;
  }
  if (((n->super_node_flags_t).NODE_FINAL & bVar1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"final",&local_31);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](m,&local_30);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void lasso_path_t::attributes(tchecker::zg::path::symbolic::node_t const & n, std::map<std::string, std::string> & m) const
{
  tchecker::ts::lasso_path_t<tchecker::zg::zg_t, tchecker::zg::path::symbolic::node_t,
                             tchecker::zg::path::symbolic::edge_t>::attributes(n, m);
  if (n.initial())
    m["initial"] = "true";
  if (n.final())
    m["final"] = "true";
}